

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O2

void makePreviewImage(Array2D<Imf_3_4::Rgba> *pixels,int width,int height,
                     Array2D<Imf_3_4::PreviewRgba> *previewPixels,int *previewWidth,
                     int *previewHeight)

{
  Rgba *pRVar1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  long lVar2;
  long lVar3;
  int x;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  long local_60;
  long local_58;
  
  *previewWidth = width / 8;
  *previewHeight = height / 8;
  Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::resizeErase
            (previewPixels,(long)(height / 8),(long)*previewWidth);
  local_58 = 0;
  local_60 = 0;
  for (lVar2 = 0; lVar2 < *previewHeight; lVar2 = lVar2 + 1) {
    lVar5 = 4;
    for (lVar4 = 0; lVar4 < *previewWidth; lVar4 = lVar4 + 1) {
      lVar6 = pixels->_sizeY * local_58;
      pRVar1 = pixels->_data;
      lVar3 = *(long *)(previewPixels + 8) * local_60 + *(long *)(previewPixels + 0x10);
      gamma((double)(ulong)*(uint *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)((long)pRVar1 + lVar5 + -4 + lVar6) * 4));
      *(undefined1 *)(lVar3 + lVar4 * 4) = extraout_AL;
      gamma((double)(ulong)*(uint *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)((long)pRVar1 + lVar5 + -2 + lVar6) * 4));
      *(undefined1 *)(lVar3 + 1 + lVar4 * 4) = extraout_AL_00;
      gamma((double)(ulong)*(uint *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)((long)&(pRVar1->r)._h + lVar5 + lVar6) * 4));
      *(undefined1 *)(lVar3 + 2 + lVar4 * 4) = extraout_AL_01;
      fVar7 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)&(pRVar1->g)._h + lVar5 + lVar6) * 4) * 255.0;
      fVar8 = 255.0;
      if (fVar7 <= 255.0) {
        fVar8 = fVar7;
      }
      *(char *)(lVar3 + 3 + lVar4 * 4) =
           (char)(int)(float)(-(uint)(fVar7 < 0.0) & 0x3f000000 |
                             ~-(uint)(fVar7 < 0.0) & (uint)(fVar8 + 0.5));
      lVar5 = lVar5 + 0x40;
    }
    local_60 = local_60 + 4;
    local_58 = local_58 + 0x40;
  }
  return;
}

Assistant:

void
makePreviewImage (
    const Array2D<Rgba>&  pixels,
    int                   width,
    int                   height,
    Array2D<PreviewRgba>& previewPixels,
    int&                  previewWidth,
    int&                  previewHeight)
{
    const int N = 8;

    previewWidth  = width / N;
    previewHeight = height / N;

    previewPixels.resizeErase (previewHeight, previewWidth);

    for (int y = 0; y < previewHeight; ++y)
    {
        for (int x = 0; x < previewWidth; ++x)
        {

            const Rgba&  inPixel  = pixels[y * N][x * N];
            PreviewRgba& outPixel = previewPixels[y][x];

            outPixel.r = gamma (inPixel.r);
            outPixel.g = gamma (inPixel.g);
            outPixel.b = gamma (inPixel.b);
            outPixel.a = static_cast<int> (IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) + 0.5f);
        }
    }
}